

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O1

node * __thiscall
YAML::detail::node_data::get(node_data *this,node *key,shared_memory_holder *pMemory)

{
  value vVar1;
  pointer ppVar2;
  element_type *peVar3;
  pointer ppVar4;
  BadSubscript *this_00;
  pointer ppVar5;
  node *unaff_R12;
  bool bVar6;
  
  vVar1 = this->m_type;
  if ((vVar1 < Scalar) || (vVar1 == Sequence)) {
    convert_to_map(this,pMemory);
  }
  else if (vVar1 == Scalar) {
    this_00 = (BadSubscript *)__cxa_allocate_exception(0x40);
    BadSubscript::BadSubscript<YAML::detail::node>(this_00,&this->m_mark,key);
    __cxa_throw(this_00,&BadSubscript::typeinfo,BadFile::~BadFile);
  }
  ppVar5 = (this->m_map).
           super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->m_map).
           super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppVar5 == ppVar2;
  if (!bVar6) {
    peVar3 = (key->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    unaff_R12 = ppVar5->second;
    if ((ppVar5->first->m_pRef).
        super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr != peVar3) {
      do {
        ppVar4 = ppVar5;
        ppVar5 = ppVar4 + 1;
        bVar6 = ppVar5 == ppVar2;
        if (bVar6) goto LAB_0071c943;
      } while ((ppVar5->first->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               peVar3);
      unaff_R12 = ppVar4[1].second;
    }
  }
LAB_0071c943:
  if (bVar6) {
    unaff_R12 = memory::create_node((((pMemory->
                                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->m_pMemory).
                                    super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    insert_map_pair(this,key,unaff_R12);
  }
  return unaff_R12;
}

Assistant:

node& node_data::get(node& key, const shared_memory_holder& pMemory) {
  switch (m_type) {
    case NodeType::Map:
      break;
    case NodeType::Undefined:
    case NodeType::Null:
    case NodeType::Sequence:
      convert_to_map(pMemory);
      break;
    case NodeType::Scalar:
      throw BadSubscript(m_mark, key);
  }

  for (const auto& it : m_map) {
    if (it.first->is(key))
      return *it.second;
  }

  node& value = pMemory->create_node();
  insert_map_pair(key, value);
  return value;
}